

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall VmaBlockMetadata_Linear::CleanupAfterFree(VmaBlockMetadata_Linear *this)

{
  undefined4 uVar1;
  uint uVar2;
  SuballocationVectorType *this_00;
  SuballocationVectorType *this_01;
  size_t sVar3;
  VmaSuballocation *pVVar4;
  VmaSuballocation *pVVar5;
  size_t sVar6;
  size_t sVar7;
  VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_> *this_02;
  VmaBlockMetadata_Linear *in_RDI;
  bool bVar8;
  size_t dstIndex;
  size_t srcIndex;
  size_t nonNullItemCount;
  size_t nullItem1stCount;
  size_t suballoc1stCount;
  SuballocationVectorType *suballocations2nd;
  SuballocationVectorType *suballocations1st;
  size_t in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  uint in_stack_ffffffffffffffb0;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_> *local_40;
  VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_> *newCount;
  
  this_00 = AccessSuballocations1st(in_RDI);
  this_01 = AccessSuballocations2nd(in_RDI);
  uVar2 = (*(in_RDI->super_VmaBlockMetadata)._vptr_VmaBlockMetadata[7])();
  if ((uVar2 & 1) == 0) {
    sVar3 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::size(this_00);
    sVar6 = in_RDI->m_1stNullItemsBeginCount;
    sVar7 = in_RDI->m_1stNullItemsMiddleCount;
    while( true ) {
      bVar8 = false;
      if (in_RDI->m_1stNullItemsBeginCount < sVar3) {
        pVVar4 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::operator[]
                           (this_00,in_RDI->m_1stNullItemsBeginCount);
        bVar8 = pVVar4->type == VMA_SUBALLOCATION_TYPE_FREE;
      }
      if (!bVar8) break;
      in_RDI->m_1stNullItemsBeginCount = in_RDI->m_1stNullItemsBeginCount + 1;
      in_RDI->m_1stNullItemsMiddleCount = in_RDI->m_1stNullItemsMiddleCount - 1;
    }
    uVar11 = 0;
    while( true ) {
      bVar8 = false;
      if (in_RDI->m_1stNullItemsMiddleCount != 0) {
        pVVar4 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::back(this_00);
        bVar8 = pVVar4->type == VMA_SUBALLOCATION_TYPE_FREE;
      }
      if (!bVar8) break;
      in_RDI->m_1stNullItemsMiddleCount = in_RDI->m_1stNullItemsMiddleCount - 1;
      VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::pop_back
                ((VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_> *)
                 CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    }
    uVar10 = 0;
    while( true ) {
      bVar8 = false;
      if (in_RDI->m_2ndNullItemsCount != 0) {
        pVVar4 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::back(this_01);
        bVar8 = pVVar4->type == VMA_SUBALLOCATION_TYPE_FREE;
      }
      if (!bVar8) break;
      in_RDI->m_2ndNullItemsCount = in_RDI->m_2ndNullItemsCount - 1;
      VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::pop_back
                ((VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_> *)
                 CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    }
    uVar9 = 0;
    while( true ) {
      bVar8 = false;
      if (in_RDI->m_2ndNullItemsCount != 0) {
        pVVar4 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::operator[]
                           (this_01,0);
        bVar8 = pVVar4->type == VMA_SUBALLOCATION_TYPE_FREE;
      }
      if (!bVar8) break;
      in_RDI->m_2ndNullItemsCount = in_RDI->m_2ndNullItemsCount - 1;
      VmaVectorRemove<VmaSuballocation,VmaStlAllocator<VmaSuballocation>>
                ((VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_> *)
                 CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff98);
    }
    bVar8 = ShouldCompact1st((VmaBlockMetadata_Linear *)
                             CONCAT17(uVar11,CONCAT16(uVar10,CONCAT15(uVar9,(uint5)
                                                  in_stack_ffffffffffffffb0))));
    if (bVar8) {
      this_02 = (VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_> *)
                (sVar3 - (sVar6 + sVar7));
      newCount = (VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_> *)
                 in_RDI->m_1stNullItemsBeginCount;
      for (local_40 = (VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_> *)0x0;
          local_40 < this_02;
          local_40 = (VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_> *)
                     ((long)&(local_40->m_Allocator).m_pCallbacks + 1)) {
        while (pVVar4 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::operator[]
                                  (this_00,(size_t)newCount),
              pVVar4->type == VMA_SUBALLOCATION_TYPE_FREE) {
          newCount = (VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_> *)
                     ((long)&(newCount->m_Allocator).m_pCallbacks + 1);
        }
        if (local_40 != newCount) {
          pVVar4 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::operator[]
                             (this_00,(size_t)newCount);
          pVVar5 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::operator[]
                             (this_00,(size_t)local_40);
          pVVar5->offset = pVVar4->offset;
          pVVar5->size = pVVar4->size;
          pVVar5->userData = pVVar4->userData;
          uVar1 = *(undefined4 *)&pVVar4->field_0x1c;
          pVVar5->type = pVVar4->type;
          *(undefined4 *)&pVVar5->field_0x1c = uVar1;
        }
        newCount = (VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_> *)
                   ((long)&(newCount->m_Allocator).m_pCallbacks + 1);
      }
      VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::resize
                (this_02,(size_t)newCount);
      in_RDI->m_1stNullItemsBeginCount = 0;
      in_RDI->m_1stNullItemsMiddleCount = 0;
    }
    bVar8 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::empty(this_01);
    if (bVar8) {
      in_RDI->m_2ndVectorMode = SECOND_VECTOR_EMPTY;
    }
    sVar6 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::size(this_00);
    if (sVar6 == in_RDI->m_1stNullItemsBeginCount) {
      VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::clear
                ((VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_> *)0x2efd37);
      in_RDI->m_1stNullItemsBeginCount = 0;
      bVar8 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::empty(this_01);
      if ((!bVar8) && (in_RDI->m_2ndVectorMode == SECOND_VECTOR_RING_BUFFER)) {
        in_RDI->m_2ndVectorMode = SECOND_VECTOR_EMPTY;
        in_RDI->m_1stNullItemsMiddleCount = in_RDI->m_2ndNullItemsCount;
        while( true ) {
          sVar6 = in_RDI->m_1stNullItemsBeginCount;
          sVar7 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::size(this_01);
          bVar8 = false;
          if (sVar6 < sVar7) {
            pVVar4 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::operator[]
                               (this_01,in_RDI->m_1stNullItemsBeginCount);
            bVar8 = pVVar4->type == VMA_SUBALLOCATION_TYPE_FREE;
          }
          if (!bVar8) break;
          in_RDI->m_1stNullItemsBeginCount = in_RDI->m_1stNullItemsBeginCount + 1;
          in_RDI->m_1stNullItemsMiddleCount = in_RDI->m_1stNullItemsMiddleCount - 1;
        }
        in_RDI->m_2ndNullItemsCount = 0;
        in_RDI->m_1stVectorIndex = in_RDI->m_1stVectorIndex ^ 1;
      }
    }
  }
  else {
    VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::clear
              ((VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_> *)0x2efa17);
    VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::clear
              ((VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_> *)0x2efa21);
    in_RDI->m_1stNullItemsBeginCount = 0;
    in_RDI->m_1stNullItemsMiddleCount = 0;
    in_RDI->m_2ndNullItemsCount = 0;
    in_RDI->m_2ndVectorMode = SECOND_VECTOR_EMPTY;
  }
  return;
}

Assistant:

void VmaBlockMetadata_Linear::CleanupAfterFree()
{
    SuballocationVectorType& suballocations1st = AccessSuballocations1st();
    SuballocationVectorType& suballocations2nd = AccessSuballocations2nd();

    if (IsEmpty())
    {
        suballocations1st.clear();
        suballocations2nd.clear();
        m_1stNullItemsBeginCount = 0;
        m_1stNullItemsMiddleCount = 0;
        m_2ndNullItemsCount = 0;
        m_2ndVectorMode = SECOND_VECTOR_EMPTY;
    }
    else
    {
        const size_t suballoc1stCount = suballocations1st.size();
        const size_t nullItem1stCount = m_1stNullItemsBeginCount + m_1stNullItemsMiddleCount;
        VMA_ASSERT(nullItem1stCount <= suballoc1stCount);

        // Find more null items at the beginning of 1st vector.
        while (m_1stNullItemsBeginCount < suballoc1stCount &&
            suballocations1st[m_1stNullItemsBeginCount].type == VMA_SUBALLOCATION_TYPE_FREE)
        {
            ++m_1stNullItemsBeginCount;
            --m_1stNullItemsMiddleCount;
        }

        // Find more null items at the end of 1st vector.
        while (m_1stNullItemsMiddleCount > 0 &&
            suballocations1st.back().type == VMA_SUBALLOCATION_TYPE_FREE)
        {
            --m_1stNullItemsMiddleCount;
            suballocations1st.pop_back();
        }

        // Find more null items at the end of 2nd vector.
        while (m_2ndNullItemsCount > 0 &&
            suballocations2nd.back().type == VMA_SUBALLOCATION_TYPE_FREE)
        {
            --m_2ndNullItemsCount;
            suballocations2nd.pop_back();
        }

        // Find more null items at the beginning of 2nd vector.
        while (m_2ndNullItemsCount > 0 &&
            suballocations2nd[0].type == VMA_SUBALLOCATION_TYPE_FREE)
        {
            --m_2ndNullItemsCount;
            VmaVectorRemove(suballocations2nd, 0);
        }

        if (ShouldCompact1st())
        {
            const size_t nonNullItemCount = suballoc1stCount - nullItem1stCount;
            size_t srcIndex = m_1stNullItemsBeginCount;
            for (size_t dstIndex = 0; dstIndex < nonNullItemCount; ++dstIndex)
            {
                while (suballocations1st[srcIndex].type == VMA_SUBALLOCATION_TYPE_FREE)
                {
                    ++srcIndex;
                }
                if (dstIndex != srcIndex)
                {
                    suballocations1st[dstIndex] = suballocations1st[srcIndex];
                }
                ++srcIndex;
            }
            suballocations1st.resize(nonNullItemCount);
            m_1stNullItemsBeginCount = 0;
            m_1stNullItemsMiddleCount = 0;
        }

        // 2nd vector became empty.
        if (suballocations2nd.empty())
        {
            m_2ndVectorMode = SECOND_VECTOR_EMPTY;
        }

        // 1st vector became empty.
        if (suballocations1st.size() - m_1stNullItemsBeginCount == 0)
        {
            suballocations1st.clear();
            m_1stNullItemsBeginCount = 0;

            if (!suballocations2nd.empty() && m_2ndVectorMode == SECOND_VECTOR_RING_BUFFER)
            {
                // Swap 1st with 2nd. Now 2nd is empty.
                m_2ndVectorMode = SECOND_VECTOR_EMPTY;
                m_1stNullItemsMiddleCount = m_2ndNullItemsCount;
                while (m_1stNullItemsBeginCount < suballocations2nd.size() &&
                    suballocations2nd[m_1stNullItemsBeginCount].type == VMA_SUBALLOCATION_TYPE_FREE)
                {
                    ++m_1stNullItemsBeginCount;
                    --m_1stNullItemsMiddleCount;
                }
                m_2ndNullItemsCount = 0;
                m_1stVectorIndex ^= 1;
            }
        }
    }

    VMA_HEAVY_ASSERT(Validate());
}